

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
AdapterPromiseNode<kj::HttpClient::ConnectRequest::Status,_kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::ConnectRequest::Status>_>
::fulfill(AdapterPromiseNode<kj::HttpClient::ConnectRequest::Status,_kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::ConnectRequest::Status>_>
          *this,Status *value)

{
  ExceptionOr<kj::HttpClient::ConnectRequest::Status> local_1e8;
  
  if (this->waiting == true) {
    this->waiting = false;
    local_1e8.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_1e8.value.ptr.isSet = true;
    local_1e8.value.ptr.field_1.value.statusCode = value->statusCode;
    local_1e8.value.ptr.field_1.value.statusText.content.ptr = (value->statusText).content.ptr;
    local_1e8.value.ptr.field_1.value.statusText.content.size_ = (value->statusText).content.size_;
    (value->statusText).content.ptr = (char *)0x0;
    (value->statusText).content.size_ = 0;
    local_1e8.value.ptr.field_1.value.statusText.content.disposer =
         (value->statusText).content.disposer;
    local_1e8.value.ptr.field_1.value.headers.disposer = (value->headers).disposer;
    local_1e8.value.ptr.field_1.value.headers.ptr = (value->headers).ptr;
    local_1e8.value.ptr.field_1.value.errorBody.ptr.disposer = (value->errorBody).ptr.disposer;
    (value->headers).ptr = (HttpHeaders *)0x0;
    local_1e8.value.ptr.field_1.value.errorBody.ptr.ptr = (value->errorBody).ptr.ptr;
    (value->errorBody).ptr.ptr = (AsyncInputStream *)0x0;
    ExceptionOr<kj::HttpClient::ConnectRequest::Status>::operator=(&this->result,&local_1e8);
    if (local_1e8.value.ptr.isSet == true) {
      HttpClient::ConnectRequest::Status::~Status(&local_1e8.value.ptr.field_1.value);
    }
    if (local_1e8.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_1e8.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }